

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decFactor.c
# Opt level: O1

Dec_Edge_t Dec_FactorLF_rec(Dec_Graph_t *pFForm,Mvc_Cover_t *pCover,Mvc_Cover_t *pSimple)

{
  Vec_Int_t *vEdgeLits;
  Dec_Node_t *pDVar1;
  size_t sVar2;
  Dec_Edge_t DVar3;
  Dec_Edge_t DVar4;
  int iVar5;
  void *pvVar6;
  Mvc_Cover_t *pDiv;
  Mvc_Cube_t *pCube;
  Dec_Node_t *pDVar7;
  Mvc_Cover_t *pRem;
  Mvc_Cover_t *pQuo;
  Mvc_Cover_t *local_40;
  Mvc_Cover_t *local_38;
  
  pvVar6 = Abc_FrameReadManDec();
  vEdgeLits = *(Vec_Int_t **)((long)pvVar6 + 0x10);
  pDiv = Mvc_CoverBestLiteralCover(pCover,pSimple);
  Mvc_CoverDivideByLiteral(pCover,pDiv,&local_38,&local_40);
  pCube = Mvc_CoverReadCubeHead(pDiv);
  DVar3 = Dec_FactorTrivialCube(pFForm,pDiv,pCube,vEdgeLits);
  Mvc_CoverFree(pDiv);
  DVar4 = Dec_Factor_rec(pFForm,local_38);
  Mvc_CoverFree(local_38);
  if (pFForm->nSize == pFForm->nCap) {
    sVar2 = (long)pFForm->nCap * 0x30;
    if (pFForm->pNodes == (Dec_Node_t *)0x0) {
      pDVar7 = (Dec_Node_t *)malloc(sVar2);
    }
    else {
      pDVar7 = (Dec_Node_t *)realloc(pFForm->pNodes,sVar2);
    }
    pFForm->pNodes = pDVar7;
    pFForm->nCap = pFForm->nCap << 1;
  }
  pDVar1 = pFForm->pNodes;
  iVar5 = pFForm->nSize;
  pFForm->nSize = iVar5 + 1;
  pDVar7 = pDVar1 + iVar5;
  pDVar7->eEdge0 = (Dec_Edge_t)0x0;
  pDVar7->eEdge1 = (Dec_Edge_t)0x0;
  (pDVar7->field_2).pFunc = (void *)0x0;
  *(undefined8 *)&pDVar1[iVar5].field_0x10 = 0;
  pDVar1[iVar5].eEdge0 = DVar3;
  pDVar1[iVar5].eEdge1 = DVar4;
  *(uint *)&pDVar1[iVar5].field_0x10 = ((uint)DVar4 & 1) << 0x10 | ((uint)DVar3 & 1) << 0xf;
  DVar3 = (Dec_Edge_t)(pFForm->nSize * 2 + 0x7ffffffeU & 0x7ffffffe);
  iVar5 = Mvc_CoverReadCubeNum(local_40);
  if (iVar5 == 0) {
    Mvc_CoverFree(local_40);
  }
  else {
    DVar4 = Dec_Factor_rec(pFForm,local_40);
    Mvc_CoverFree(local_40);
    if (pFForm->nSize == pFForm->nCap) {
      sVar2 = (long)pFForm->nCap * 0x30;
      if (pFForm->pNodes == (Dec_Node_t *)0x0) {
        pDVar7 = (Dec_Node_t *)malloc(sVar2);
      }
      else {
        pDVar7 = (Dec_Node_t *)realloc(pFForm->pNodes,sVar2);
      }
      pFForm->pNodes = pDVar7;
      pFForm->nCap = pFForm->nCap << 1;
    }
    pDVar1 = pFForm->pNodes;
    iVar5 = pFForm->nSize;
    pFForm->nSize = iVar5 + 1;
    pDVar7 = pDVar1 + iVar5;
    pDVar7->eEdge0 = (Dec_Edge_t)0x0;
    pDVar7->eEdge1 = (Dec_Edge_t)0x0;
    (pDVar7->field_2).pFunc = (void *)0x0;
    *(undefined8 *)&pDVar1[iVar5].field_0x10 = 0;
    *(uint *)&pDVar1[iVar5].field_0x10 = ((uint)DVar4 & 1) << 0x10 | 0x4000;
    pDVar1[iVar5].eEdge0 = (Dec_Edge_t)((uint)DVar3 | 1);
    pDVar1[iVar5].eEdge1 = (Dec_Edge_t)((uint)DVar4 ^ 1);
    DVar3 = (Dec_Edge_t)((pFForm->nSize * 2 + 0x7ffffffeU & 0x7ffffffe) + 1);
  }
  return DVar3;
}

Assistant:

Dec_Edge_t Dec_FactorLF_rec( Dec_Graph_t * pFForm, Mvc_Cover_t * pCover, Mvc_Cover_t * pSimple )
{
    Dec_Man_t * pManDec = (Dec_Man_t *)Abc_FrameReadManDec();
    Vec_Int_t * vEdgeLits  = pManDec->vLits;
    Mvc_Cover_t * pDiv, * pQuo, * pRem;
    Dec_Edge_t eNodeDiv, eNodeQuo, eNodeRem;
    Dec_Edge_t eNodeAnd;

    // get the most often occurring literal
    pDiv = Mvc_CoverBestLiteralCover( pCover, pSimple );
    // divide the cover by the literal
    Mvc_CoverDivideByLiteral( pCover, pDiv, &pQuo, &pRem );
    // get the node pointer for the literal
    eNodeDiv = Dec_FactorTrivialCube( pFForm, pDiv, Mvc_CoverReadCubeHead(pDiv), vEdgeLits );
    Mvc_CoverFree( pDiv );
    // factor the quotient and remainder
    eNodeQuo = Dec_Factor_rec( pFForm, pQuo );
    Mvc_CoverFree( pQuo );
    eNodeAnd = Dec_GraphAddNodeAnd( pFForm, eNodeDiv, eNodeQuo );
    if ( Mvc_CoverReadCubeNum(pRem) == 0 )
    {
        Mvc_CoverFree( pRem );
        return eNodeAnd;
    }
    else
    {
        eNodeRem = Dec_Factor_rec( pFForm, pRem );
        Mvc_CoverFree( pRem );
        return Dec_GraphAddNodeOr( pFForm,  eNodeAnd, eNodeRem );
    }
}